

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaf.hpp
# Opt level: O0

Group * metaf::GroupParser::parseAlternative<3ul>
                  (string *group,ReportPart reportPart,ReportMetadata *reportMetadata)

{
  bool bVar1;
  TrendGroup *in_RDI;
  ReportMetadata *unaff_retaddr;
  ReportPart in_stack_0000000c;
  undefined8 in_stack_00000010;
  optional<metaf::TrendGroup> parsed;
  ReportMetadata *in_stack_00000140;
  ReportPart in_stack_0000014c;
  string *in_stack_00000150;
  TrendGroup *this;
  
  this = in_RDI;
  TrendGroup::parse(in_stack_00000150,in_stack_0000014c,in_stack_00000140);
  bVar1 = std::optional<metaf::TrendGroup>::has_value((optional<metaf::TrendGroup> *)0x266f8d);
  if (bVar1) {
    std::optional<metaf::TrendGroup>::operator*((optional<metaf::TrendGroup> *)0x266f9d);
    std::
    variant<metaf::KeywordGroup,metaf::LocationGroup,metaf::ReportTimeGroup,metaf::TrendGroup,metaf::WindGroup,metaf::VisibilityGroup,metaf::CloudGroup,metaf::WeatherGroup,metaf::TemperatureGroup,metaf::PressureGroup,metaf::RunwayStateGroup,metaf::SeaSurfaceGroup,metaf::MinMaxTemperatureGroup,metaf::PrecipitationGroup,metaf::LayerForecastGroup,metaf::PressureTendencyGroup,metaf::CloudTypesGroup,metaf::LowMidHighCloudGroup,metaf::LightningGroup,metaf::VicinityGroup,metaf::MiscGroup,metaf::UnknownGroup>
    ::variant<metaf::TrendGroup_const&,void,void,metaf::TrendGroup,void>
              ((variant<metaf::KeywordGroup,_metaf::LocationGroup,_metaf::ReportTimeGroup,_metaf::TrendGroup,_metaf::WindGroup,_metaf::VisibilityGroup,_metaf::CloudGroup,_metaf::WeatherGroup,_metaf::TemperatureGroup,_metaf::PressureGroup,_metaf::RunwayStateGroup,_metaf::SeaSurfaceGroup,_metaf::MinMaxTemperatureGroup,_metaf::PrecipitationGroup,_metaf::LayerForecastGroup,_metaf::PressureTendencyGroup,_metaf::CloudTypesGroup,_metaf::LowMidHighCloudGroup,_metaf::LightningGroup,_metaf::VicinityGroup,_metaf::MiscGroup,_metaf::UnknownGroup>
                *)this,in_RDI);
  }
  else {
    parseAlternative<4ul>((string *)in_stack_00000010,in_stack_0000000c,unaff_retaddr);
  }
  return (Group *)this;
}

Assistant:

static Group parseAlternative(const std::string & group,
		ReportPart reportPart,
		const ReportMetadata & reportMetadata)
	{
		using Alternative = std::variant_alternative_t<I, Group>;
		if constexpr (!std::is_same<Alternative, FallbackGroup>::value) {
			const auto parsed = Alternative::parse(group, reportPart, reportMetadata);
			if (parsed.has_value()) return *parsed;
		}
		if constexpr (I >= (std::variant_size_v<Group> - 1)) {
			return FallbackGroup();
		} else {
			return parseAlternative<I+1>(group, reportPart, reportMetadata);
		}
	}